

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O2

ssize_t __thiscall QFSFileEngine::read(QFSFileEngine *this,int __fd,void *__buf,size_t __nbytes)

{
  QFSFileEnginePrivate *this_00;
  qint64 qVar1;
  undefined4 in_register_00000034;
  
  this_00 = (QFSFileEnginePrivate *)(this->super_QAbstractFileEngine).d_ptr.d;
  if (this_00->lastIOCommand != IOReadCommand) {
    (*(this->super_QAbstractFileEngine)._vptr_QAbstractFileEngine[4])();
    this_00->lastIOCommand = IOReadCommand;
  }
  qVar1 = QFSFileEnginePrivate::nativeRead
                    (this_00,(char *)CONCAT44(in_register_00000034,__fd),(qint64)__buf);
  return qVar1;
}

Assistant:

qint64 QFSFileEngine::read(char *data, qint64 maxlen)
{
    Q_D(QFSFileEngine);

    // On Windows' stdlib implementation, the results of calling fread and
    // fwrite are undefined if not called either in sequence, or if preceded
    // with a call to fflush().
    if (d->lastIOCommand != QFSFileEnginePrivate::IOReadCommand) {
        flush();
        d->lastIOCommand = QFSFileEnginePrivate::IOReadCommand;
    }

    return d->nativeRead(data, maxlen);
}